

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer_device.cpp
# Opt level: O1

AffineSpace3fa *
embree::calculate_interpolated_space
          (AffineSpace3fa *__return_storage_ptr__,ISPCInstance *instance,float gtime)

{
  Vector *pVVar1;
  AffineSpace3fa *pAVar2;
  uint uVar3;
  AffineSpace3fa *pAVar4;
  AffineSpace3fa *pAVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined8 uVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  
  uVar3 = instance->numTimeSteps;
  if (uVar3 == 1) {
    pAVar4 = instance->spaces;
    uVar36 = *(undefined8 *)((long)&(pAVar4->l).vx.field_0 + 8);
    *(undefined8 *)&(__return_storage_ptr__->l).vx.field_0 = *(undefined8 *)&(pAVar4->l).vx.field_0;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vx.field_0 + 8) = uVar36;
    uVar36 = *(undefined8 *)((long)&(pAVar4->l).vy.field_0 + 8);
    *(undefined8 *)&(__return_storage_ptr__->l).vy.field_0 = *(undefined8 *)&(pAVar4->l).vy.field_0;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vy.field_0 + 8) = uVar36;
    uVar36 = *(undefined8 *)((long)&(pAVar4->l).vz.field_0 + 8);
    *(undefined8 *)&(__return_storage_ptr__->l).vz.field_0 = *(undefined8 *)&(pAVar4->l).vz.field_0;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vz.field_0 + 8) = uVar36;
    uVar36 = *(undefined8 *)((long)&(pAVar4->p).field_0 + 8);
    *(undefined8 *)&(__return_storage_ptr__->p).field_0 = *(undefined8 *)&(pAVar4->p).field_0;
    *(undefined8 *)((long)&(__return_storage_ptr__->p).field_0 + 8) = uVar36;
  }
  else {
    fVar39 = (float)(int)(uVar3 - 1) * gtime;
    fVar37 = floorf(fVar39);
    uVar6 = uVar3 - 2;
    if ((int)fVar37 < (int)(uVar3 - 2)) {
      uVar6 = (int)fVar37;
    }
    uVar3 = 0;
    if (0 < (int)uVar6) {
      uVar3 = uVar6;
    }
    fVar39 = fVar39 - (float)(int)uVar3;
    fVar38 = 1.0 - fVar39;
    pAVar5 = instance->spaces;
    pAVar4 = pAVar5 + uVar3;
    fVar37 = (pAVar4->l).vx.field_0.m128[1];
    fVar7 = (pAVar4->l).vx.field_0.m128[2];
    fVar8 = (pAVar4->l).vx.field_0.m128[3];
    pVVar1 = &pAVar5[uVar3].l.vy;
    fVar9 = (pVVar1->field_0).m128[0];
    fVar10 = (pVVar1->field_0).m128[1];
    fVar11 = (pVVar1->field_0).m128[2];
    fVar12 = (pVVar1->field_0).m128[3];
    pVVar1 = &pAVar5[uVar3].l.vz;
    fVar13 = (pVVar1->field_0).m128[0];
    fVar14 = (pVVar1->field_0).m128[1];
    fVar15 = (pVVar1->field_0).m128[2];
    fVar16 = (pVVar1->field_0).m128[3];
    pVVar1 = &pAVar5[uVar3].p;
    fVar17 = (pVVar1->field_0).m128[0];
    fVar18 = (pVVar1->field_0).m128[1];
    fVar19 = (pVVar1->field_0).m128[2];
    fVar20 = (pVVar1->field_0).m128[3];
    pAVar2 = pAVar5 + (ulong)uVar3 + 1;
    fVar21 = (pAVar2->l).vx.field_0.m128[1];
    fVar22 = (pAVar2->l).vx.field_0.m128[2];
    fVar23 = (pAVar2->l).vx.field_0.m128[3];
    pVVar1 = &pAVar5[(ulong)uVar3 + 1].l.vy;
    fVar24 = (pVVar1->field_0).m128[0];
    fVar25 = (pVVar1->field_0).m128[1];
    fVar26 = (pVVar1->field_0).m128[2];
    fVar27 = (pVVar1->field_0).m128[3];
    pVVar1 = &pAVar5[(ulong)uVar3 + 1].l.vz;
    fVar28 = (pVVar1->field_0).m128[0];
    fVar29 = (pVVar1->field_0).m128[1];
    fVar30 = (pVVar1->field_0).m128[2];
    fVar31 = (pVVar1->field_0).m128[3];
    pVVar1 = &pAVar5[(ulong)uVar3 + 1].p;
    fVar32 = (pVVar1->field_0).m128[0];
    fVar33 = (pVVar1->field_0).m128[1];
    fVar34 = (pVVar1->field_0).m128[2];
    fVar35 = (pVVar1->field_0).m128[3];
    (__return_storage_ptr__->l).vx.field_0.m128[0] =
         (pAVar2->l).vx.field_0.m128[0] * fVar39 + (pAVar4->l).vx.field_0.m128[0] * fVar38;
    (__return_storage_ptr__->l).vx.field_0.m128[1] = fVar21 * fVar39 + fVar37 * fVar38;
    (__return_storage_ptr__->l).vx.field_0.m128[2] = fVar22 * fVar39 + fVar7 * fVar38;
    (__return_storage_ptr__->l).vx.field_0.m128[3] = fVar23 * fVar39 + fVar8 * fVar38;
    (__return_storage_ptr__->l).vy.field_0.m128[0] = fVar24 * fVar39 + fVar9 * fVar38;
    (__return_storage_ptr__->l).vy.field_0.m128[1] = fVar25 * fVar39 + fVar10 * fVar38;
    (__return_storage_ptr__->l).vy.field_0.m128[2] = fVar26 * fVar39 + fVar11 * fVar38;
    (__return_storage_ptr__->l).vy.field_0.m128[3] = fVar27 * fVar39 + fVar12 * fVar38;
    (__return_storage_ptr__->l).vz.field_0.m128[0] = fVar28 * fVar39 + fVar13 * fVar38;
    (__return_storage_ptr__->l).vz.field_0.m128[1] = fVar29 * fVar39 + fVar14 * fVar38;
    (__return_storage_ptr__->l).vz.field_0.m128[2] = fVar30 * fVar39 + fVar15 * fVar38;
    (__return_storage_ptr__->l).vz.field_0.m128[3] = fVar31 * fVar39 + fVar16 * fVar38;
    (__return_storage_ptr__->p).field_0.m128[0] = fVar39 * fVar32 + fVar38 * fVar17;
    (__return_storage_ptr__->p).field_0.m128[1] = fVar39 * fVar33 + fVar38 * fVar18;
    (__return_storage_ptr__->p).field_0.m128[2] = fVar39 * fVar34 + fVar38 * fVar19;
    (__return_storage_ptr__->p).field_0.m128[3] = fVar39 * fVar35 + fVar38 * fVar20;
  }
  return __return_storage_ptr__;
}

Assistant:

AffineSpace3fa calculate_interpolated_space (ISPCInstance* instance, float gtime)
{
  if (instance->numTimeSteps == 1)
    return AffineSpace3fa(instance->spaces[0]);

   /* calculate time segment itime and fractional time ftime */
  const int time_segments = instance->numTimeSteps-1;
  const float time = gtime*(float)(time_segments);
  const int itime = clamp((int)(floor(time)),(int)0,time_segments-1);
  const float ftime = time - (float)(itime);
  return (1.0f-ftime)*AffineSpace3fa(instance->spaces[itime+0]) + ftime*AffineSpace3fa(instance->spaces[itime+1]);
}